

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetDeviceTwinCallback
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback,void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetDeviceTwinCallback",0x976,1,
                "Invalid argument specified iothubClientHandle=%p",0);
    }
  }
  else if (deviceTwinCallback == (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0) {
    (*iotHubClientHandle->IoTHubTransport_Unsubscribe_DeviceTwin)
              (iotHubClientHandle->transportHandle);
    iotHubClientHandle->deviceTwinCallback = (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0;
    l._4_4_ = IOTHUB_CLIENT_OK;
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin)
                      (iotHubClientHandle->transportHandle);
    if (iVar1 == 0) {
      iotHubClientHandle->deviceTwinCallback = deviceTwinCallback;
      iotHubClientHandle->deviceTwinContextCallback = userContextCallback;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetDeviceTwinCallback(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("Invalid argument specified iothubClientHandle=%p", iotHubClientHandle);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (deviceTwinCallback == NULL)
        {
            handleData->IoTHubTransport_Unsubscribe_DeviceTwin(handleData->transportHandle);
            handleData->deviceTwinCallback = NULL;
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceTwin(handleData->transportHandle) == 0)
            {
                handleData->deviceTwinCallback = deviceTwinCallback;
                handleData->deviceTwinContextCallback = userContextCallback;
                result = IOTHUB_CLIENT_OK;
            }
            else
            {
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }
    return result;
}